

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_resampler.cpp
# Opt level: O3

long __thiscall
cubeb_resampler_speex<float,_delay_line<float>,_cubeb_resampler_speex_one_way<float>_>::
fill_internal_input(cubeb_resampler_speex<float,_delay_line<float>,_cubeb_resampler_speex_one_way<float>_>
                    *this,float *input_buffer,long *input_frames_count,float *output_buffer,
                   long param_4)

{
  delay_line<float> *pdVar1;
  float *pfVar2;
  long lVar3;
  uint32_t frames_needed;
  ulong uVar4;
  size_t frames_resampled;
  size_t local_30;
  
  frames_needed = (uint32_t)*input_frames_count;
  uVar4 = *input_frames_count & 0xffffffff;
  pdVar1 = (this->input_processor)._M_t.
           super___uniq_ptr_impl<delay_line<float>,_std::default_delete<delay_line<float>_>_>._M_t.
           super__Tuple_impl<0UL,_delay_line<float>_*,_std::default_delete<delay_line<float>_>_>.
           super__Head_base<0UL,_delay_line<float>_*,_false>._M_head_impl;
  auto_array<float>::push
            (&pdVar1->delay_input_buffer,input_buffer,(pdVar1->super_processor).channels * uVar4);
  if (frames_needed == 0) {
    lVar3 = *input_frames_count;
  }
  else {
    local_30 = 0;
    pfVar2 = delay_line<float>::output
                       ((this->input_processor)._M_t.
                        super___uniq_ptr_impl<delay_line<float>,_std::default_delete<delay_line<float>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_delay_line<float>_*,_std::default_delete<delay_line<float>_>_>
                        .super__Head_base<0UL,_delay_line<float>_*,_false>._M_head_impl,
                        frames_needed,&local_30);
    *input_frames_count = local_30;
    lVar3 = (*this->data_callback)(this->stream,this->user_ptr,pfVar2,(void *)0x0,uVar4);
    lVar3 = (lVar3 / (long)uVar4) * *input_frames_count;
  }
  return lVar3;
}

Assistant:

long
cubeb_resampler_speex<T, InputProcessor, OutputProcessor>::fill_internal_input(
    T * input_buffer, long * input_frames_count, T * output_buffer,
    long /*output_frames_needed*/)
{
  assert(input_buffer && input_frames_count && *input_frames_count &&
         !output_buffer);

  /* The input data, after eventual resampling. This is passed to the callback.
   */
  T * resampled_input = nullptr;
  uint32_t resampled_frame_count =
      input_processor->output_for_input(*input_frames_count);

  /* process the input, and present exactly `output_frames_needed` in the
   * callback. */
  input_processor->input(input_buffer, *input_frames_count);

  /* resampled_frame_count == 0 happens if the resampler
   * doesn't have enough input frames buffered to produce 1 resampled frame. */
  if (resampled_frame_count == 0) {
    return *input_frames_count;
  }

  size_t frames_resampled = 0;
  resampled_input =
      input_processor->output(resampled_frame_count, &frames_resampled);
  *input_frames_count = frames_resampled;

  long got = data_callback(stream, user_ptr, resampled_input, nullptr,
                           resampled_frame_count);

  /* Return the number of initial input frames or part of it.
   * Since output_frames_needed == 0 in input scenario, the only
   * available number outside resampler is the initial number of frames. */
  return (*input_frames_count) * (got / resampled_frame_count);
}